

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

bool __thiscall
cmProcess::StartProcess
          (cmProcess *this,uv_loop_t *loop,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *affinity)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pcVar6;
  cmCTest *pcVar7;
  uv_pipe_s *puVar8;
  reference puVar9;
  reference pvVar10;
  uv_stream_t *stream;
  string local_7e8 [32];
  undefined1 local_7c8 [8];
  ostringstream cmCTestLog_msg_3;
  string local_650 [32];
  undefined1 local_630 [8];
  ostringstream cmCTestLog_msg_2;
  unsigned_long p;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_490 [8];
  vector<char,_std::allocator<char>_> cpumask;
  uv_process_options_t options;
  uv_stdio_container_t stdio [3];
  string local_3f0 [32];
  undefined1 local_3d0 [8];
  ostringstream cmCTestLog_msg_1;
  uv_file local_258 [2];
  int fds [2];
  uv_pipe_ptr pipe_reader;
  uv_pipe_ptr pipe_writer;
  string local_228 [32];
  undefined1 local_208 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_78 [4];
  int status;
  uv_timer_ptr timer;
  value_type local_60;
  reference local_58;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  rep local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *affinity_local;
  uv_loop_t *loop_local;
  cmProcess *this_local;
  
  this->ProcessState = Error;
  local_28 = affinity;
  affinity_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)loop;
  loop_local = (uv_loop_t *)this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    this_local._7_1_ = 0;
    goto LAB_002b9447;
  }
  local_30 = std::chrono::_V2::steady_clock::now();
  (this->StartTime).__d.__r = local_30;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear(&this->ProcessArgs);
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            (&this->ProcessArgs,(value_type *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Arguments);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->Arguments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_60 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&this->ProcessArgs,&local_60);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            (&this->ProcessArgs,
             (value_type *)
             &timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
              super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::cm::uv_timer_ptr::uv_timer_ptr((uv_timer_ptr *)local_78);
  iVar2 = ::cm::uv_timer_ptr::init((uv_timer_ptr *)local_78,(EVP_PKEY_CTX *)affinity_local);
  if (iVar2 == 0) {
    ::cm::uv_pipe_ptr::uv_pipe_ptr
              ((uv_pipe_ptr *)
               &pipe_reader.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)fds);
    ::cm::uv_pipe_ptr::init
              ((uv_pipe_ptr *)
               &pipe_reader.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (EVP_PKEY_CTX *)affinity_local);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)fds,(EVP_PKEY_CTX *)affinity_local);
    local_258[0] = -1;
    local_258[1] = -1;
    iVar2 = cmGetPipes(local_258);
    if (iVar2 == 0) {
      puVar8 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_((uv_handle_ptr_ *)fds);
      uv_pipe_open(puVar8,local_258[0]);
      puVar8 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                         ((uv_handle_ptr_ *)
                          &pipe_reader.super_uv_handle_ptr_<uv_pipe_s>.
                           super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                           super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      uv_pipe_open(puVar8,local_258[1]);
      options.cpumask_size._0_4_ = 2;
      ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                ((uv_pipe_ptr *)
                 &pipe_reader.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                  handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      memset(&cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,0,0x50);
      options.exit_cb = (uv_exit_cb)std::__cxx11::string::data();
      options.file = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                                       (&this->ProcessArgs);
      options.cwd._4_4_ = 3;
      cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = OnExitCB;
      options._40_8_ = &options.cpumask_size;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_490);
      if (local_28 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
LAB_002b9039:
        options.uid = 0;
        options.gid = 0;
        options.cpumask = (char *)0x0;
      }
      else {
        bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(local_28);
        if (bVar1) goto LAB_002b9039;
        iVar2 = uv_cpumask_size();
        __range2._7_1_ = 0;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)local_490,(long)iVar2,
                   (value_type *)((long)&__range2 + 7));
        this_00 = local_28;
        __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(local_28);
        p = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)&p);
          if (!bVar1) break;
          puVar9 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&__end2);
          pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)local_490,*puVar9);
          *pvVar10 = '\x01';
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end2);
        }
        options._56_8_ =
             std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_490);
        options.cpumask =
             (char *)std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)local_490);
      }
      stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)fds);
      iVar2 = uv_read_start(stream,OnAllocateCB,OnReadCB);
      if (iVar2 == 0) {
        iVar2 = ::cm::uv_process_ptr::spawn
                          (&this->Process,(uv_loop_t *)affinity_local,
                           (uv_process_options_t *)
                           &cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10,this);
        if (iVar2 == 0) {
          ::cm::uv_pipe_ptr::operator=(&this->PipeReader,(uv_pipe_ptr *)fds);
          ::cm::uv_timer_ptr::operator=(&this->Timer,(uv_timer_ptr *)local_78);
          StartTimer(this);
          this->ProcessState = Executing;
          this_local._7_1_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c8);
          poVar4 = std::operator<<((ostream *)local_7c8,"Process not started\n ");
          poVar4 = std::operator<<(poVar4,(string *)&this->Command);
          poVar4 = std::operator<<(poVar4,"\n[");
          pcVar5 = uv_strerror(iVar2);
          poVar4 = std::operator<<(poVar4,pcVar5);
          std::operator<<(poVar4,"]\n");
          pcVar6 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                             (&this->Runner);
          pcVar7 = cmCTestRunTest::GetCTest(pcVar6);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar7,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                       ,0x8c,pcVar5,false);
          std::__cxx11::string::~string(local_7e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c8);
          this_local._7_1_ = 0;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
        poVar4 = std::operator<<((ostream *)local_630,"Error starting read events: ");
        pcVar5 = uv_strerror(iVar2);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar6 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                           (&this->Runner);
        pcVar7 = cmCTestRunTest::GetCTest(pcVar6);
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar7,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                     ,0x84,pcVar5,false);
        std::__cxx11::string::~string(local_650);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
        this_local._7_1_ = 0;
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_490);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
      poVar4 = std::operator<<((ostream *)local_3d0,"Error initializing pipe: ");
      pcVar5 = uv_strerror(iVar2);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar6 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                         (&this->Runner);
      pcVar7 = cmCTestRunTest::GetCTest(pcVar6);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar7,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                   ,0x59,pcVar5,false);
      std::__cxx11::string::~string(local_3f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
      this_local._7_1_ = 0;
    }
    ::cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)fds);
    ::cm::uv_pipe_ptr::~uv_pipe_ptr
              ((uv_pipe_ptr *)
               &pipe_reader.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
                handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    poVar4 = std::operator<<((ostream *)local_208,"Error initializing timer: ");
    pcVar5 = uv_strerror(iVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar6 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                       (&this->Runner);
    pcVar7 = cmCTestRunTest::GetCTest(pcVar6);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar7,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                 ,0x4a,pcVar5,false);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
    this_local._7_1_ = 0;
  }
  ::cm::uv_timer_ptr::~uv_timer_ptr((uv_timer_ptr *)local_78);
LAB_002b9447:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmProcess::StartProcess(uv_loop_t& loop, std::vector<size_t>* affinity)
{
  this->ProcessState = cmProcess::State::Error;
  if (this->Command.empty()) {
    return false;
  }
  this->StartTime = std::chrono::steady_clock::now();
  this->ProcessArgs.clear();
  // put the command as arg0
  this->ProcessArgs.push_back(this->Command.c_str());
  // now put the command arguments in
  for (std::string const& arg : this->Arguments) {
    this->ProcessArgs.push_back(arg.c_str());
  }
  this->ProcessArgs.push_back(nullptr); // null terminate the list

  cm::uv_timer_ptr timer;
  int status = timer.init(loop, this);
  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error initializing timer: " << uv_strerror(status)
                                            << std::endl);
    return false;
  }

  cm::uv_pipe_ptr pipe_writer;
  cm::uv_pipe_ptr pipe_reader;

  pipe_writer.init(loop, 0);
  pipe_reader.init(loop, 0, this);

  int fds[2] = { -1, -1 };
  status = cmGetPipes(fds);
  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error initializing pipe: " << uv_strerror(status)
                                           << std::endl);
    return false;
  }

  uv_pipe_open(pipe_reader, fds[0]);
  uv_pipe_open(pipe_writer, fds[1]);

  uv_stdio_container_t stdio[3];
  stdio[0].flags = UV_INHERIT_FD;
  stdio[0].data.fd = 0;
  stdio[1].flags = UV_INHERIT_STREAM;
  stdio[1].data.stream = pipe_writer;
  stdio[2] = stdio[1];

  uv_process_options_t options = uv_process_options_t();
  options.file = this->Command.data();
  options.args = const_cast<char**>(this->ProcessArgs.data());
  options.stdio_count = 3; // in, out and err
  options.exit_cb = &cmProcess::OnExitCB;
  options.stdio = stdio;
#if !defined(CMAKE_USE_SYSTEM_LIBUV)
  std::vector<char> cpumask;
  if (affinity && !affinity->empty()) {
    cpumask.resize(static_cast<size_t>(uv_cpumask_size()), 0);
    for (auto p : *affinity) {
      cpumask[p] = 1;
    }
    options.cpumask = cpumask.data();
    options.cpumask_size = cpumask.size();
  } else {
    options.cpumask = nullptr;
    options.cpumask_size = 0;
  }
#else
  static_cast<void>(affinity);
#endif

  status =
    uv_read_start(pipe_reader, &cmProcess::OnAllocateCB, &cmProcess::OnReadCB);

  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error starting read events: " << uv_strerror(status)
                                              << std::endl);
    return false;
  }

  status = this->Process.spawn(loop, options, this);
  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Process not started\n " << this->Command << "\n["
                                        << uv_strerror(status) << "]\n");
    return false;
  }

  this->PipeReader = std::move(pipe_reader);
  this->Timer = std::move(timer);

  this->StartTimer();

  this->ProcessState = cmProcess::State::Executing;
  return true;
}